

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockContextUpdateUndocking(ImGuiContext *ctx)

{
  bool bVar1;
  ImGuiStoragePair *pIVar2;
  ImGuiDockRequest *pIVar3;
  ImGuiContext *in_RDI;
  ImGuiDockRequest *req;
  int n_1;
  ImGuiDockNode *node;
  int n;
  ImGuiDockContext *dc;
  ImGuiContext *g;
  ImGuiID in_stack_00000094;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int i;
  ImGuiDockNode *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  ImGuiWindow *window;
  
  window = (ImGuiWindow *)in_RDI->DockContext;
  if (((in_RDI->IO).ConfigFlags & 0x40U) == 0) {
    if ((0 < *(int *)&window->Name) || (0 < window->FlagsPreviousFrame)) {
      DockContextClearNodes
                ((ImGuiContext *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (ImGuiID)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                 SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x18,0));
    }
  }
  else {
    if (((in_RDI->IO).ConfigDockingNoSplit & 1U) != 0) {
      for (in_stack_ffffffffffffffe4 = 0; in_stack_ffffffffffffffe4 < *(int *)&window->Name;
          in_stack_ffffffffffffffe4 = in_stack_ffffffffffffffe4 + 1) {
        pIVar2 = ImVector<ImGuiStorage::ImGuiStoragePair>::operator[]
                           ((ImVector<ImGuiStorage::ImGuiStoragePair> *)window,
                            in_stack_ffffffffffffffe4);
        in_stack_ffffffffffffffd8 = (ImGuiDockNode *)(pIVar2->field_1).val_p;
        if (((in_stack_ffffffffffffffd8 != (ImGuiDockNode *)0x0) &&
            (bVar1 = ImGuiDockNode::IsRootNode(in_stack_ffffffffffffffd8), bVar1)) &&
           (bVar1 = ImGuiDockNode::IsSplitNode(in_stack_ffffffffffffffd8), bVar1)) {
          DockBuilderRemoveNodeChildNodes(in_stack_00000094);
        }
      }
    }
    if ((window->ViewportId & 1) != 0) {
      DockContextRebuildNodes
                ((ImGuiContext *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      *(undefined1 *)&window->ViewportId = 0;
    }
    for (i = 0; i < window->FlagsPreviousFrame; i = i + 1) {
      pIVar3 = ImVector<ImGuiDockRequest>::operator[]
                         ((ImVector<ImGuiDockRequest> *)&window->FlagsPreviousFrame,i);
      if ((pIVar3->Type == ImGuiDockRequestType_Undock) &&
         (pIVar3->UndockTargetWindow != (ImGuiWindow *)0x0)) {
        DockContextProcessUndockWindow
                  (in_RDI,window,SUB41((uint)in_stack_ffffffffffffffe4 >> 0x18,0));
      }
      else if ((pIVar3->Type == ImGuiDockRequestType_Undock) &&
              (pIVar3->UndockTargetNode != (ImGuiDockNode *)0x0)) {
        DockContextProcessUndockNode
                  ((ImGuiContext *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffd8);
      }
    }
  }
  return;
}

Assistant:

void ImGui::DockContextUpdateUndocking(ImGuiContext* ctx)
{
    ImGuiContext& g = *ctx;
    ImGuiDockContext* dc = ctx->DockContext;
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
    {
        if (dc->Nodes.Data.Size > 0 || dc->Requests.Size > 0)
            DockContextClearNodes(ctx, 0, true);
        return;
    }

    // Setting NoSplit at runtime merges all nodes
    if (g.IO.ConfigDockingNoSplit)
        for (int n = 0; n < dc->Nodes.Data.Size; n++)
            if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
                if (node->IsRootNode() && node->IsSplitNode())
                {
                    DockBuilderRemoveNodeChildNodes(node->ID);
                    //dc->WantFullRebuild = true;
                }

    // Process full rebuild
#if 0
    if (ImGui::IsKeyPressed(ImGui::GetKeyIndex(ImGuiKey_C)))
        dc->WantFullRebuild = true;
#endif
    if (dc->WantFullRebuild)
    {
        DockContextRebuildNodes(ctx);
        dc->WantFullRebuild = false;
    }

    // Process Undocking requests (we need to process them _before_ the UpdateMouseMovingWindowNewFrame call in NewFrame)
    for (int n = 0; n < dc->Requests.Size; n++)
    {
        ImGuiDockRequest* req = &dc->Requests[n];
        if (req->Type == ImGuiDockRequestType_Undock && req->UndockTargetWindow)
            DockContextProcessUndockWindow(ctx, req->UndockTargetWindow);
        else if (req->Type == ImGuiDockRequestType_Undock && req->UndockTargetNode)
            DockContextProcessUndockNode(ctx, req->UndockTargetNode);
    }
}